

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetLite
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  bool bVar1;
  FieldSkipper *in_RCX;
  ExtensionFinder *in_RDX;
  CodedInputStream *in_RSI;
  ExtensionSet *in_RDI;
  uint32 unaff_retaddr;
  CodedInputStream *in_stack_00000008;
  uint32 tag;
  uint32 v;
  CodedInputStream *pCVar2;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  uint local_4;
  
  while( true ) {
    pCVar2 = in_RSI;
    if ((in_RSI->buffer_ < in_RSI->buffer_end_) &&
       (local_4 = (uint)*in_RSI->buffer_, local_4 < 0x80)) {
      io::CodedInputStream::Advance(in_RSI,1);
    }
    else {
      local_4 = io::CodedInputStream::ReadTagFallback(in_stack_00000008,unaff_retaddr);
    }
    in_RSI->last_tag_ = local_4;
    if (local_4 == 0) break;
    if (local_4 == 0xb) {
      bVar1 = ParseMessageSetItemLite(in_RDI,pCVar2,in_RDX,in_RCX);
      in_RSI = pCVar2;
      if (!bVar1) {
        return false;
      }
    }
    else {
      bVar1 = ParseField((ExtensionSet *)
                         CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                         (uint32)((ulong)in_RDI >> 0x20),pCVar2,in_RDX,in_RCX);
      in_RSI = pCVar2;
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool ExtensionSet::ParseMessageSetLite(io::CodedInputStream* input,
                                       ExtensionFinder* extension_finder,
                                       FieldSkipper* field_skipper) {
  while (true) {
    const uint32 tag = input->ReadTag();
    switch (tag) {
      case 0:
        return true;
      case WireFormatLite::kMessageSetItemStartTag:
        if (!ParseMessageSetItemLite(input, extension_finder, field_skipper)) {
          return false;
        }
        break;
      default:
        if (!ParseField(tag, input, extension_finder, field_skipper)) {
          return false;
        }
        break;
    }
  }
}